

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_core_ll.c
# Opt level: O3

IOTHUB_CLIENT_RESULT
IoTHubClientCore_LL_SetInputMessageCallbackImpl
          (IOTHUB_CLIENT_CORE_LL_HANDLE iotHubClientHandle,char *inputName,
          IOTHUB_CLIENT_MESSAGE_CALLBACK_ASYNC eventHandlerCallback,
          IOTHUB_CLIENT_MESSAGE_CALLBACK_ASYNC_EX eventHandlerCallbackEx,void *userContextCallback,
          void *userContextCallbackEx,size_t userContextCallbackExLength)

{
  int iVar1;
  LIST_ITEM_HANDLE pLVar2;
  IOTHUB_EVENT_CALLBACK *pIVar3;
  LOGGER_LOG p_Var4;
  SINGLYLINKEDLIST_HANDLE pSVar5;
  STRING_HANDLE pSVar6;
  void *pvVar7;
  char *pcVar8;
  IOTHUB_CLIENT_RESULT IVar9;
  char *pcVar10;
  bool bVar11;
  
  if (iotHubClientHandle == (IOTHUB_CLIENT_CORE_LL_HANDLE)0x0) {
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 == (LOGGER_LOG)0x0) {
      return IOTHUB_CLIENT_INVALID_ARG;
    }
    pcVar8 = "IoTHubClientCore_LL_SetInputMessageCallbackImpl";
    pcVar10 = "Invalid argument - iotHubClientHandle=%p, inputName=%p";
    IVar9 = IOTHUB_CLIENT_INVALID_ARG;
    iVar1 = 0xcad;
    goto LAB_00121c0e;
  }
  pSVar5 = iotHubClientHandle->event_callbacks;
  if (eventHandlerCallback == (IOTHUB_CLIENT_MESSAGE_CALLBACK_ASYNC)0x0 &&
      eventHandlerCallbackEx == (IOTHUB_CLIENT_MESSAGE_CALLBACK_ASYNC_EX)0x0) {
    pLVar2 = singlylinkedlist_find(pSVar5,is_event_equal_for_match,inputName);
    if (pLVar2 == (LIST_ITEM_HANDLE)0x0) {
      p_Var4 = xlogging_get_log_function();
      IVar9 = IOTHUB_CLIENT_ERROR;
      if (p_Var4 == (LOGGER_LOG)0x0) {
        return IOTHUB_CLIENT_ERROR;
      }
      pcVar8 = "remove_event_unsubscribe_if_needed";
      pcVar10 = "Input name %s was not present";
      iVar1 = 0xc85;
    }
    else {
      pIVar3 = (IOTHUB_EVENT_CALLBACK *)singlylinkedlist_item_get_value(pLVar2);
      if (pIVar3 == (IOTHUB_EVENT_CALLBACK *)0x0) {
        p_Var4 = xlogging_get_log_function();
        IVar9 = IOTHUB_CLIENT_ERROR;
        if (p_Var4 == (LOGGER_LOG)0x0) {
          return IOTHUB_CLIENT_ERROR;
        }
        pcVar8 = "remove_event_unsubscribe_if_needed";
        pcVar10 = "singlylinkedlist_item_get_value failed";
        iVar1 = 0xc8d;
      }
      else {
        delete_event(pIVar3);
        iVar1 = singlylinkedlist_remove(iotHubClientHandle->event_callbacks,pLVar2);
        if (iVar1 == 0) {
          pLVar2 = singlylinkedlist_get_head_item(iotHubClientHandle->event_callbacks);
          if (pLVar2 != (LIST_ITEM_HANDLE)0x0) {
            return IOTHUB_CLIENT_OK;
          }
          (*iotHubClientHandle->IoTHubTransport_Unsubscribe_InputQueue)
                    (iotHubClientHandle->deviceHandle);
          return IOTHUB_CLIENT_OK;
        }
        p_Var4 = xlogging_get_log_function();
        IVar9 = IOTHUB_CLIENT_ERROR;
        if (p_Var4 == (LOGGER_LOG)0x0) {
          return IOTHUB_CLIENT_ERROR;
        }
        pcVar8 = "remove_event_unsubscribe_if_needed";
        pcVar10 = "singlylinkedlist_remove failed";
        iVar1 = 0xc95;
      }
    }
    goto LAB_00121c0e;
  }
  if (pSVar5 == (SINGLYLINKEDLIST_HANDLE)0x0) {
    bVar11 = false;
LAB_00121917:
    pSVar5 = singlylinkedlist_create();
    iotHubClientHandle->event_callbacks = pSVar5;
    if (pSVar5 != (SINGLYLINKEDLIST_HANDLE)0x0) goto LAB_0012192f;
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 != (LOGGER_LOG)0x0) {
      pcVar8 = "Could not allocate linked list for callbacks";
      iVar1 = 0xc2b;
      goto LAB_00121b90;
    }
  }
  else {
    pLVar2 = singlylinkedlist_get_head_item(pSVar5);
    bVar11 = pLVar2 != (LIST_ITEM_HANDLE)0x0;
    pSVar5 = iotHubClientHandle->event_callbacks;
    if (pSVar5 == (SINGLYLINKEDLIST_HANDLE)0x0) goto LAB_00121917;
LAB_0012192f:
    pLVar2 = singlylinkedlist_find(pSVar5,is_event_equal_for_match,inputName);
    if (pLVar2 == (LIST_ITEM_HANDLE)0x0) {
      pIVar3 = (IOTHUB_EVENT_CALLBACK *)calloc(1,0x28);
      if (pIVar3 != (IOTHUB_EVENT_CALLBACK *)0x0) goto LAB_001219a7;
      p_Var4 = xlogging_get_log_function();
      if (p_Var4 != (LOGGER_LOG)0x0) {
        pcVar8 = "Could not allocate IOTHUB_EVENT_CALLBACK";
        iVar1 = 0xc37;
        goto LAB_00121b90;
      }
    }
    else {
      pIVar3 = (IOTHUB_EVENT_CALLBACK *)singlylinkedlist_item_get_value(pLVar2);
      if (pIVar3 == (IOTHUB_EVENT_CALLBACK *)0x0) {
        p_Var4 = xlogging_get_log_function();
        if (p_Var4 != (LOGGER_LOG)0x0) {
          pcVar8 = "singlylinkedlist_item_get_value failed looking up event callback";
          iVar1 = 0xc45;
LAB_00121b90:
          (*p_Var4)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                    ,"create_event_handler_callback",iVar1,1,pcVar8);
        }
      }
      else {
LAB_001219a7:
        if ((inputName == (char *)0x0) || (pIVar3->inputName != (STRING_HANDLE)0x0)) {
LAB_001219c9:
          pIVar3->callbackAsync = eventHandlerCallback;
          pIVar3->callbackAsyncEx = eventHandlerCallbackEx;
          free(pIVar3->userContextCallbackEx);
          pIVar3->userContextCallbackEx = (void *)0x0;
          if (userContextCallbackEx == (void *)0x0) {
            pIVar3->userContextCallback = userContextCallback;
LAB_00121aac:
            if ((pLVar2 != (LIST_ITEM_HANDLE)0x0) ||
               (pLVar2 = singlylinkedlist_add(iotHubClientHandle->event_callbacks,pIVar3),
               pLVar2 != (LIST_ITEM_HANDLE)0x0)) {
              if (userContextCallbackEx != (void *)0x0) {
                memcpy(pIVar3->userContextCallbackEx,userContextCallbackEx,
                       userContextCallbackExLength);
              }
              if ((!bVar11) &&
                 (iVar1 = (*iotHubClientHandle->IoTHubTransport_Subscribe_InputQueue)
                                    (iotHubClientHandle->deviceHandle), iVar1 != 0)) {
                p_Var4 = xlogging_get_log_function();
                if (p_Var4 != (LOGGER_LOG)0x0) {
                  (*p_Var4)(AZ_LOG_ERROR,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                            ,"IoTHubClientCore_LL_SetInputMessageCallbackImpl",0xcc0,1,
                            "IoTHubTransport_Subscribe_InputQueue failed");
                }
                delete_event_callback_list(iotHubClientHandle);
                return IOTHUB_CLIENT_ERROR;
              }
              return IOTHUB_CLIENT_OK;
            }
            p_Var4 = xlogging_get_log_function();
            if (p_Var4 == (LOGGER_LOG)0x0) goto LAB_00121bd1;
            pcVar8 = "Unable to add eventCallback to list";
            iVar1 = 0xc66;
          }
          else {
            pvVar7 = malloc(userContextCallbackExLength);
            pIVar3->userContextCallbackEx = pvVar7;
            if (pvVar7 != (void *)0x0) goto LAB_00121aac;
            p_Var4 = xlogging_get_log_function();
            if (p_Var4 == (LOGGER_LOG)0x0) goto LAB_00121bd1;
            pcVar8 = "Unable to allocate userContextCallback";
            iVar1 = 0xc60;
          }
          (*p_Var4)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                    ,"create_event_handler_callback",iVar1,1,pcVar8);
        }
        else {
          pSVar6 = STRING_construct(inputName);
          pIVar3->inputName = pSVar6;
          if (pSVar6 != (STRING_HANDLE)0x0) goto LAB_001219c9;
        }
LAB_00121bd1:
        delete_event(pIVar3);
      }
    }
  }
  p_Var4 = xlogging_get_log_function();
  IVar9 = IOTHUB_CLIENT_ERROR;
  if (p_Var4 == (LOGGER_LOG)0x0) {
    return IOTHUB_CLIENT_ERROR;
  }
  pcVar8 = "IoTHubClientCore_LL_SetInputMessageCallbackImpl";
  pcVar10 = "create_event_handler_callback call failed, error = %d";
  iVar1 = 0xcbc;
LAB_00121c0e:
  (*p_Var4)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
            ,pcVar8,iVar1,1,pcVar10);
  return IVar9;
}

Assistant:

IOTHUB_CLIENT_RESULT IoTHubClientCore_LL_SetInputMessageCallbackImpl(IOTHUB_CLIENT_CORE_LL_HANDLE iotHubClientHandle, const char* inputName, IOTHUB_CLIENT_MESSAGE_CALLBACK_ASYNC eventHandlerCallback, IOTHUB_CLIENT_MESSAGE_CALLBACK_ASYNC_EX eventHandlerCallbackEx, void *userContextCallback, void *userContextCallbackEx, size_t userContextCallbackExLength)
{
    IOTHUB_CLIENT_RESULT result;

    if (iotHubClientHandle == NULL)
    {
        LogError("Invalid argument - iotHubClientHandle=%p, inputName=%p", iotHubClientHandle, inputName);
        result = IOTHUB_CLIENT_INVALID_ARG;
    }
    else
    {
        IOTHUB_CLIENT_CORE_LL_HANDLE_DATA* handleData = (IOTHUB_CLIENT_CORE_LL_HANDLE_DATA*)iotHubClientHandle;
        if ((eventHandlerCallback == NULL) && (eventHandlerCallbackEx == NULL))
        {
            result = (IOTHUB_CLIENT_RESULT)remove_event_unsubscribe_if_needed(handleData, inputName);
        }
        else
        {
            bool registered_with_transport_handler = (handleData->event_callbacks != NULL) && (singlylinkedlist_get_head_item(handleData->event_callbacks) != NULL);
            if ((result = (IOTHUB_CLIENT_RESULT)create_event_handler_callback(handleData, inputName, eventHandlerCallback, eventHandlerCallbackEx, userContextCallback, userContextCallbackEx, userContextCallbackExLength)) != IOTHUB_CLIENT_OK)
            {
                LogError("create_event_handler_callback call failed, error = %d", result);
            }
            else if (!registered_with_transport_handler && (handleData->IoTHubTransport_Subscribe_InputQueue(handleData->deviceHandle) != 0))
            {
                LogError("IoTHubTransport_Subscribe_InputQueue failed");
                delete_event_callback_list(handleData);
                result = IOTHUB_CLIENT_ERROR;
            }
            else
            {
                result = IOTHUB_CLIENT_OK;
            }
        }
    }
    return result;

}